

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgetanimator_p.cpp
# Opt level: O1

void QWidgetAnimator::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  QObject::sender();
  QMetaObject::cast((QObject *)&QPropertyAnimation::staticMetaObject);
  QPropertyAnimation::targetObject();
  abort((QWidgetAnimator *)_o);
  return;
}

Assistant:

void QWidgetAnimator::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetAnimator *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->animationFinished(); break;
        default: ;
        }
    }
    (void)_a;
}